

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O1

bool __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
::elementBegin(ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
               *this,ParserChar *elementName,ParserAttributes *attributes)

{
  iterator *piVar1;
  size_t *psVar2;
  size_t *psVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  IUnknownElementHandler *pIVar7;
  _Elt_pointer pNVar8;
  mapped_type pIVar9;
  _Elt_pointer pEVar10;
  bool bVar11;
  byte bVar12;
  char cVar13;
  byte bVar14;
  bool bVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  _Base_ptr p_Var19;
  mapped_type *ppIVar20;
  code *pcVar22;
  _Elt_pointer pNVar23;
  size_t *psVar24;
  _Elt_pointer pNVar25;
  _Base_ptr p_Var26;
  ElementFunctionMap *pEVar27;
  undefined4 uVar28;
  undefined8 unaff_RBP;
  _Base_ptr p_Var29;
  long *plVar30;
  _Rb_tree_header *p_Var31;
  StringHashPair SVar32;
  void *attributeData;
  StringHash namespaceHash;
  StringHashPair hashPair;
  void *validationData;
  long local_70;
  _Base_ptr local_68;
  undefined4 local_5c;
  StringHashPair local_58;
  size_t sStack_48;
  void *pvStack_40;
  undefined8 local_38;
  _Rb_tree_header *p_Var21;
  
  sVar4 = this->mIgnoreElements;
  sVar5 = this->mUnknownElements;
  sVar6 = this->mNamespaceElements;
  if (((sVar4 != 0 || sVar5 != 0) || sVar6 != 0) &&
     (pNVar23 = (this->mNamespacesStack).c.
                super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur,
     pNVar23 !=
     (this->mNamespacesStack).c.
     super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
     ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
    if (pNVar23 ==
        (this->mNamespacesStack).c.
        super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pNVar23 = (this->mNamespacesStack).c.
                super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
    }
    pNVar23[-1].counter = pNVar23[-1].counter + 1;
  }
  psVar2 = &this->mIgnoreElements;
  if (sVar4 == 0) {
    if (sVar5 == 0) {
      if (sVar6 != 0) {
        this->mNamespaceElements = sVar6 + 1;
        local_58 = Utils::calculateStringHashWithNamespace(elementName);
        bVar12 = (**(code **)(*(long *)this->mActiveNamespaceHandler + 0x10))
                           (this->mActiveNamespaceHandler,
                            &((ElementData *)&local_58)->generatedElementHash,elementName,
                            attributes->attributes);
        goto LAB_006db05d;
      }
      iVar16 = (*(this->super_ParserTemplateBase).super_Parser._vptr_Parser[7])(this);
      if ((char)iVar16 != '\0') {
        parseNamespaceDeclarations(this,attributes);
      }
      SVar32 = Utils::calculateStringHashWithNamespace(elementName);
      uVar18 = SVar32.first;
      local_68 = (_Base_ptr)0x0;
      pNVar23 = (this->mNamespacesStack).c.
                super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pNVar23 !=
          (this->mNamespacesStack).c.
          super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        pNVar8 = (this->mNamespacesStack).c.
                 super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
        if (pNVar23 == pNVar8) {
          psVar3 = &(this->mNamespacesStack).c.
                    super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1][8].counter;
          *psVar3 = *psVar3 + 1;
          pNVar25 = (this->mNamespacesStack).c.
                    super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
        }
        else {
          pNVar23[-1].counter = pNVar23[-1].counter + 1;
          pNVar25 = pNVar23;
        }
        p_Var26 = &pNVar25[-1].namespaces._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var19 = p_Var26;
        for (p_Var29 = pNVar25[-1].namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
            ; p_Var29 != (_Base_ptr)0x0;
            p_Var29 = (&p_Var29->_M_left)[*(ulong *)(p_Var29 + 1) < uVar18]) {
          if (*(ulong *)(p_Var29 + 1) >= uVar18) {
            p_Var19 = p_Var29;
          }
        }
        if ((p_Var19 != p_Var26) && (*(ulong *)(p_Var19 + 1) <= uVar18)) {
          p_Var26 = p_Var19;
        }
        if (pNVar23 == pNVar8) {
          pNVar23 = (this->mNamespacesStack).c.
                    super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
        }
        if ((_Rb_tree_header *)p_Var26 != &pNVar23[-1].namespaces._M_t._M_impl.super__Rb_tree_header
           ) {
          local_68 = p_Var26[1]._M_parent;
        }
      }
      local_58.second = 0;
      local_58.first = SVar32.second;
      sStack_48 = 0;
      pvStack_40 = (void *)0x0;
      iVar16 = (*(this->super_ParserTemplateBase).super_Parser._vptr_Parser[5])(this);
      if ((char)iVar16 == '\0') {
LAB_006db23e:
        uVar28 = 0;
      }
      else {
        p_Var21 = &(this->mElementToNamespaceMap)._M_t._M_impl.super__Rb_tree_header;
        p_Var29 = (this->mElementToNamespaceMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent;
        p_Var19 = &p_Var21->_M_header;
        for (; p_Var29 != (_Base_ptr)0x0;
            p_Var29 = (&p_Var29->_M_left)[*(ulong *)(p_Var29 + 1) < local_58.second]) {
          if (*(ulong *)(p_Var29 + 1) >= local_58.second) {
            p_Var19 = p_Var29;
          }
        }
        p_Var29 = &p_Var21->_M_header;
        if (((_Rb_tree_header *)p_Var19 != p_Var21) &&
           (p_Var29 = p_Var19, local_58.second < *(ulong *)(p_Var19 + 1))) {
          p_Var29 = &p_Var21->_M_header;
        }
        if ((_Rb_tree_header *)p_Var29 == p_Var21) goto LAB_006db23e;
        uVar28 = (undefined4)
                 CONCAT71((int7)((ulong)unaff_RBP >> 8),p_Var29[1]._M_parent == local_68);
      }
      pEVar27 = &this->mElementFunctionMap;
      if (this->mCurrentElementFunctionMap != (ElementFunctionMap *)0x0) {
        pEVar27 = this->mCurrentElementFunctionMap;
      }
      p_Var21 = &(pEVar27->_M_t)._M_impl.super__Rb_tree_header;
      p_Var31 = p_Var21;
      if (((char)iVar16 != '\0') &&
         (((char)uVar28 != '\0' || (this->mLaxNamespaceHandling == true)))) {
        p_Var29 = (pEVar27->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var19 = &p_Var21->_M_header;
        for (; (_Rb_tree_header *)p_Var29 != (_Rb_tree_header *)0x0;
            p_Var29 = (&p_Var29->_M_left)[*(ulong *)(p_Var29 + 1) < local_58.second]) {
          if (*(ulong *)(p_Var29 + 1) >= local_58.second) {
            p_Var19 = p_Var29;
          }
        }
        if (((_Rb_tree_header *)p_Var19 != p_Var21) &&
           (p_Var31 = (_Rb_tree_header *)p_Var19,
           local_58.second < ((_Rb_tree_header *)p_Var19)->_M_node_count)) {
          p_Var31 = p_Var21;
        }
      }
      if (p_Var31 == p_Var21) {
        ppIVar20 = std::
                   map<unsigned_long,_GeneratedSaxParser::INamespaceHandler_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::INamespaceHandler_*>_>_>
                   ::operator[](&this->mNamespaceHandlers,(key_type *)&local_68);
        pIVar9 = *ppIVar20;
        if (pIVar9 == (mapped_type)0x0) {
          psVar3 = &this->mUnknownElements;
          local_5c = uVar28;
          uVar17 = (*(this->super_ParserTemplateBase).super_Parser._vptr_Parser[6])(this);
          p_Var21 = (_Rb_tree_header *)(ulong)uVar17;
          psVar24 = psVar3;
          if ((char)uVar17 == '\0') {
            p_Var29 = (this->mElementFunctionMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_parent;
            p_Var21 = &(this->mElementFunctionMap)._M_t._M_impl.super__Rb_tree_header;
            p_Var19 = &p_Var21->_M_header;
            for (; (_Rb_tree_header *)p_Var29 != (_Rb_tree_header *)0x0;
                p_Var29 = (&p_Var29->_M_left)[*(ulong *)(p_Var29 + 1) < local_58.first]) {
              if (*(ulong *)(p_Var29 + 1) >= local_58.first) {
                p_Var19 = p_Var29;
              }
            }
            p_Var31 = p_Var21;
            if (((_Rb_tree_header *)p_Var19 != p_Var21) &&
               (p_Var31 = (_Rb_tree_header *)p_Var19,
               local_58.first < ((_Rb_tree_header *)p_Var19)->_M_node_count)) {
              p_Var31 = p_Var21;
            }
            if (p_Var31 != p_Var21) {
              psVar24 = psVar2;
            }
            if ((char)local_5c == '\0') {
              psVar24 = psVar3;
            }
          }
          bVar12 = (byte)p_Var21;
          *psVar24 = 1;
          if (*psVar2 != 0) {
            bVar12 = 1;
            goto LAB_006db396;
          }
          if (*psVar3 == 0) {
            bVar11 = true;
          }
          else {
            pIVar7 = this->mUnknownHandler;
            if (pIVar7 != (IUnknownElementHandler *)0x0) {
              iVar16 = (*pIVar7->_vptr_IUnknownElementHandler[2])
                                 (pIVar7,elementName,attributes->attributes);
              bVar12 = (byte)iVar16;
              goto LAB_006db396;
            }
            bVar11 = false;
            bVar15 = ParserTemplateBase::handleError
                               (&this->super_ParserTemplateBase,SEVERITY_ERROR_NONCRITICAL,
                                ERROR_UNKNOWN_ELEMENT,0,elementName);
            bVar12 = !bVar15;
          }
        }
        else {
          this->mActiveNamespaceHandler = pIVar9;
          this->mNamespaceElements = 1;
          bVar12 = (**(code **)(*(long *)pIVar9 + 0x10))
                             (pIVar9,(ElementData *)&local_58,elementName,attributes->attributes);
LAB_006db396:
          bVar11 = false;
        }
        if (!bVar11) goto LAB_006db05d;
      }
      local_70 = 0;
      local_38 = 0;
      pcVar22 = *(code **)((long)(p_Var31 + 2) + 8);
      if (pcVar22 != (code *)0x0) {
        plVar30 = (long *)((long)&(this->super_ParserTemplateBase).super_Parser._vptr_Parser +
                          *(long *)((long)(p_Var31 + 2) + 0x10));
        if (((ulong)pcVar22 & 1) != 0) {
          pcVar22 = *(code **)(pcVar22 + *plVar30 + -1);
        }
        cVar13 = (*pcVar22)(plVar30,attributes,&local_70,&local_38);
        if (cVar13 != '\0') {
          pcVar22 = *(code **)(p_Var31 + 1);
          plVar30 = (long *)((long)&(this->super_ParserTemplateBase).super_Parser._vptr_Parser +
                            *(long *)((long)(p_Var31 + 1) + 8));
          if (((ulong)pcVar22 & 1) != 0) {
            pcVar22 = *(code **)(pcVar22 + *plVar30 + -1);
          }
          bVar14 = (*pcVar22)(plVar30,local_70);
          bVar12 = bVar14;
          if (local_70 != 0) {
            pcVar22 = *(code **)(p_Var31 + 3);
            if (((ulong)pcVar22 & 1) != 0) {
              pcVar22 = *(code **)(pcVar22 +
                                  *(long *)((long)&(this->super_ParserTemplateBase).super_Parser.
                                                   _vptr_Parser + *(long *)((long)(p_Var31 + 3) + 8)
                                           ) + -1);
            }
            bVar12 = (*pcVar22)();
            StackMemoryManager::deleteObject(&(this->super_ParserTemplateBase).mStackMemoryManager);
            bVar12 = bVar14 & bVar12;
          }
          if (bVar12 != 0) {
            pEVar10 = (this->super_ParserTemplateBase).mElementDataStack.
                      super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (pEVar10 ==
                (this->super_ParserTemplateBase).mElementDataStack.
                super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::
              deque<GeneratedSaxParser::ParserTemplateBase::ElementData,std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>>
              ::_M_push_back_aux<GeneratedSaxParser::ParserTemplateBase::ElementData_const&>
                        ((deque<GeneratedSaxParser::ParserTemplateBase::ElementData,std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>>
                          *)&(this->super_ParserTemplateBase).mElementDataStack,
                         (ElementData *)&local_58);
              bVar12 = bVar14;
            }
            else {
              pEVar10->typeID = sStack_48;
              pEVar10->validationData = pvStack_40;
              pEVar10->elementHash = local_58.first;
              pEVar10->generatedElementHash = local_58.second;
              piVar1 = &(this->super_ParserTemplateBase).mElementDataStack.
                        super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                        ._M_impl.super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
              bVar12 = bVar14;
            }
          }
          goto LAB_006db05d;
        }
      }
      if (local_70 != 0) {
        pcVar22 = *(code **)(p_Var31 + 3);
        if (((ulong)pcVar22 & 1) != 0) {
          pcVar22 = *(code **)(pcVar22 +
                              *(long *)((long)&(this->super_ParserTemplateBase).super_Parser.
                                               _vptr_Parser + *(long *)((long)(p_Var31 + 3) + 8)) +
                              -1);
        }
        (*pcVar22)();
        StackMemoryManager::deleteObject(&(this->super_ParserTemplateBase).mStackMemoryManager);
      }
      bVar12 = 0;
      goto LAB_006db05d;
    }
    this->mUnknownElements = sVar5 + 1;
    pIVar7 = this->mUnknownHandler;
    if (pIVar7 != (IUnknownElementHandler *)0x0) {
      iVar16 = (*pIVar7->_vptr_IUnknownElementHandler[2])(pIVar7,elementName,attributes->attributes)
      ;
      return SUB41(iVar16,0);
    }
  }
  else {
    *psVar2 = sVar4 + 1;
  }
  bVar12 = 1;
LAB_006db05d:
  return (bool)(bVar12 & 1);
}

Assistant:

bool ParserTemplate<DerivedClass, ImplClass>::elementBegin( const ParserChar* elementName,
																   const ParserAttributes& attributes)
	{
        if ( (mIgnoreElements > 0 || mUnknownElements > 0 || mNamespaceElements > 0) 
            && !mNamespacesStack.empty() )
        {
            mNamespacesStack.top().counter++;
        }
        if ( mIgnoreElements > 0 )
        {
            mIgnoreElements++;
            return true;
        }
        if ( mUnknownElements > 0 )
        {
            mUnknownElements++;
            if ( mUnknownHandler != 0 )
            {
                return mUnknownHandler->elementBegin( elementName, attributes.attributes );
            }
            else
            {
                return true;
            }
        }
        if ( mNamespaceElements > 0 )
        {
            mNamespaceElements++;
            StringHashPair hashPair = Utils::calculateStringHashWithNamespace( elementName );
            return mActiveNamespaceHandler->elementBegin( hashPair.second, elementName, attributes.attributes );
        }

        if ( isDifferentNamespaceAllowed() )
        {
            parseNamespaceDeclarations( attributes );
        }
        ElementData newElementData;
        StringHashPair elementNsPair = Utils::calculateStringHashWithNamespace(elementName);
        newElementData.elementHash = elementNsPair.second;
        StringHash currentNsPrefix = elementNsPair.first;
        StringHash namespaceHash = 0;
        if ( !mNamespacesStack.empty() )
        {
            mNamespacesStack.top().counter++;
            typename NamespacePrefixesMap::iterator nsIter = mNamespacesStack.top().namespaces.find( currentNsPrefix );
            if ( nsIter != mNamespacesStack.top().namespaces.end() )
            {
                namespaceHash = nsIter->second;
            }
        }
        newElementData.generatedElementHash = 0;
        newElementData.typeID = 0;
        newElementData.validationData = 0;
        bool foundElementHash = findElementHash( newElementData );

        bool correctNamespace = false;
        if ( foundElementHash )
        {
            typename NamespacePrefixesMap::const_iterator nsFromMap = mElementToNamespaceMap.find( newElementData.generatedElementHash );
            if ( nsFromMap != mElementToNamespaceMap.end() && nsFromMap->second == namespaceHash )
            {
                correctNamespace = true;
            }
        }

        const ElementFunctionMap* functionMapToUse;
        if ( mCurrentElementFunctionMap )
            functionMapToUse = mCurrentElementFunctionMap;
        else
            functionMapToUse = &mElementFunctionMap;
        typename ElementFunctionMap::const_iterator it = functionMapToUse->end();
        if ( foundElementHash && (correctNamespace || mLaxNamespaceHandling) )
            it = functionMapToUse->find(newElementData.generatedElementHash);
		if ( it == functionMapToUse->end() )
		{
            INamespaceHandler* nsHandler = mNamespaceHandlers[ namespaceHash ];
            if ( nsHandler != 0 )
            {
                mActiveNamespaceHandler = nsHandler;
                mNamespaceElements = 1;
                return nsHandler->elementBegin( newElementData.elementHash, elementName, attributes.attributes );
            }
            if ( isXsAnyAllowed( newElementData.elementHash ) )
            {
                mUnknownElements = 1;
            }
            else
            {
                it = mElementFunctionMap.find(newElementData.elementHash);
                if ( it != mElementFunctionMap.end() && correctNamespace )
                {
                    mIgnoreElements = 1;
                }
                else
                {
                    mUnknownElements = 1;
                }
            }
            if ( mIgnoreElements )
            {
                return true;
            }
            if ( mUnknownElements )
            {
                if ( mUnknownHandler != 0 )
                {
                    return mUnknownHandler->elementBegin( elementName, attributes.attributes );
                }
                else
                {
			        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
							         ParserError::ERROR_UNKNOWN_ELEMENT,
				                     0,
				                     elementName))
			        {
				        return false;
			        }
			        else
			        {
				        return true;
			        }
                }
            }
		}
		const FunctionStruct& functions = it->second;

		void* attributeData = 0;
		void* validationData = 0;
		if ( !functions.validateBeginFunction || !(static_cast<DerivedClass*>(this)->*functions.validateBeginFunction)(attributes, &attributeData, &validationData) )
        {
            // avoid leak
            if ( attributeData )
            {
                (static_cast<DerivedClass*>(this)->*functions.freeAttributesFunction)(attributeData);
                mStackMemoryManager.deleteObject(); // attribute data
            }
			return false;
        }

		bool success = (static_cast<DerivedClass*>(this)->*functions.beginFunction)(attributeData);
		if ( attributeData )
        {
            bool attrFreeSuccess = (static_cast<DerivedClass*>(this)->*functions.freeAttributesFunction)(attributeData);
			mStackMemoryManager.deleteObject(); // attribute data
            if ( !attrFreeSuccess )
            {
                return false;
            }
        }

		if ( success )
		{
            mElementDataStack.push_back(newElementData);
			newElementData.validationData = validationData;
		}
		return success;
	}